

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void UserInterface::pushMessage(string *s,bool isError)

{
  bool bVar1;
  ostream *this;
  size_type sVar2;
  byte in_SIL;
  string *in_RDI;
  Color messageColor;
  iterator listIter;
  list<TextButton,_std::allocator<TextButton>_> *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffb94;
  value_type *in_stack_fffffffffffffb98;
  list<TextButton,_std::allocator<TextButton>_> *this_00;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  list<TextButton,_std::allocator<TextButton>_> local_420;
  Vector2u local_3fc;
  Color local_3f4 [21];
  Color *in_stack_fffffffffffffc60;
  Color *in_stack_fffffffffffffc68;
  float in_stack_fffffffffffffc74;
  float in_stack_fffffffffffffc78;
  uint in_stack_fffffffffffffc7c;
  Color *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  TextButton *in_stack_fffffffffffffc90;
  function<void_(int)> *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  Color local_3c;
  Color local_38;
  Color local_34;
  Int64 local_30;
  Int64 local_28;
  _Self local_20;
  _Self local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  this = std::operator<<((ostream *)&std::cout,in_RDI);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  sVar2 = std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::size
                    ((list<TextButton,_std::allocator<TextButton>_> *)
                     CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  if (sVar2 < 4) {
    bVar1 = std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::empty
                      (&_messageList_abi_cxx11_);
    if (bVar1) {
      local_30 = (Int64)sf::Clock::restart((Clock *)CONCAT44(in_stack_fffffffffffffbac,
                                                             in_stack_fffffffffffffba8));
    }
  }
  else {
    std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::pop_back
              ((list<TextButton,_std::allocator<TextButton>_> *)
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::begin
                   (in_stack_fffffffffffffb88);
    while( true ) {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::end
                     (in_stack_fffffffffffffb88);
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      std::_List_iterator<TextButton>::operator->((_List_iterator<TextButton> *)0x1ab2e0);
      sf::Transformable::move
                ((Transformable *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 (float)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                 SUB84(in_stack_fffffffffffffb88,0));
      std::_List_iterator<TextButton>::operator++(&local_18);
    }
    local_28 = (Int64)sf::Clock::restart((Clock *)CONCAT44(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8));
  }
  sf::Color::Color(&local_34);
  if ((local_9 & 1) == 0) {
    sf::Color::Color(&local_38,'\x1f','=',0xff,200);
    local_34 = local_38;
  }
  else {
    sf::Color::Color(&local_3c,0xff,'\x1f','\x1f',200);
    local_34 = local_3c;
  }
  sf::Color::Color(local_3f4,'\0','\0','\0',200);
  local_3fc = Simulator::getWindowSize();
  std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::size
            ((list<TextButton,_std::allocator<TextButton>_> *)
             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  this_00 = &local_420;
  std::function<void_(int)>::function
            ((function<void_(int)> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88);
  uVar3 = 0;
  TextButton::TextButton
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
             in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffca8);
  std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::push_front
            (this_00,in_stack_fffffffffffffb98);
  TextButton::~TextButton((TextButton *)CONCAT44(in_stack_fffffffffffffb94,uVar3));
  std::function<void_(int)>::~function((function<void_(int)> *)0x1ab507);
  return;
}

Assistant:

void UserInterface::pushMessage(const string& s, bool isError) {
    cout << s << endl;
    if (_messageList.size() >= 4) {
        _messageList.pop_back();
        for (auto listIter = _messageList.begin(); listIter != _messageList.end(); ++listIter) {
            listIter->move(0.0f, 30.0f);
        }
        _messageClock.restart();
    } else if (_messageList.empty()) {
        _messageClock.restart();
    }
    
    Color messageColor;
    if (!isError) {
        messageColor = Color(31, 61, 255, 200);
    } else {
        messageColor = Color(255, 31, 31, 200);
    }
    _messageList.push_front(TextButton(s, Color(0, 0, 0, 200), 16, 10.0f, Simulator::getWindowSize().y - 35.0f - _messageList.size() * 30.0f, messageColor, Color::Black, nullptr));
}